

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

Result __thiscall tcu::ThreadUtil::Event::waitReady(Event *this)

{
  Mutex *this_00;
  
  this_00 = &this->m_lock;
  de::Mutex::lock(this_00);
  if (this->m_result == RESULT_NOT_READY) {
    this->m_waiterCount = this->m_waiterCount + 1;
    de::Mutex::unlock(this_00);
    de::Semaphore::decrement(&this->m_waiters);
  }
  else {
    de::Mutex::unlock(this_00);
  }
  return this->m_result;
}

Assistant:

Event::Result Event::waitReady (void)
{
	m_lock.lock();

	if (m_result == RESULT_NOT_READY)
		m_waiterCount++;
	else
	{
		m_lock.unlock();
		return m_result;
	}

	m_lock.unlock();

	m_waiters.decrement();

	return m_result;
}